

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::Set(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,SQInteger selfidx)

{
  bool bVar1;
  SQChar *pSVar2;
  SQChar *pSVar3;
  SQObjectPtr *pSVar4;
  SQInstance *in_RCX;
  uint *in_RDX;
  int *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr *in_R8;
  SQObjectPtr *unaff_retaddr;
  SQObjectPtr *in_stack_00000008;
  SQObjectPtr *in_stack_00000010;
  SQVM *in_stack_00000018;
  SQObjectPtr *in_stack_ffffffffffffff98;
  SQObjectPtr *in_stack_ffffffffffffffa0;
  SQTable *in_stack_ffffffffffffffa8;
  SQArray *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  bool local_1;
  
  if ((*(byte *)(in_RSI + 1) & 1) == 0) {
    iVar5 = *in_RSI;
    if (iVar5 == 0x8000040) {
      if ((*in_RDX & 0x4000000) == 0) {
        pSVar2 = GetTypeName((SQObjectPtr *)0x168e5d);
        pSVar3 = GetTypeName((SQObjectPtr *)0x168e6c);
        Raise_Error(in_RDI,"indexing %s with %s",pSVar2,pSVar3);
        local_1 = false;
      }
      else {
        if (*in_RDX == 0x5000004) {
          pSVar4 = (SQObjectPtr *)(long)(float)in_RDX[2];
        }
        else {
          pSVar4 = *(SQObjectPtr **)(in_RDX + 2);
        }
        bVar1 = SQArray::Set(in_stack_ffffffffffffffb8,*(SQInteger *)(in_RSI + 2),pSVar4);
        if (bVar1) {
          local_1 = true;
        }
        else {
          Raise_IdxError((SQVM *)CONCAT44(iVar5,in_stack_ffffffffffffffc0),
                         (SQObjectPtr *)in_stack_ffffffffffffffb8);
          local_1 = false;
        }
      }
    }
    else {
      if (iVar5 == 0xa000020) {
        bVar1 = SQTable::Set(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                             in_stack_ffffffffffffff98);
        if (bVar1) {
          return true;
        }
      }
      else if (iVar5 != 0xa000080) {
        if (iVar5 != 0xa008000) {
          pSVar2 = GetTypeName((SQObjectPtr *)0x168f13);
          Raise_Error(in_RDI,"trying to set \'%s\'",pSVar2);
          return false;
        }
        bVar1 = SQInstance::Set(in_RCX,in_R8,(SQObjectPtr *)in_RDI);
        if (bVar1) {
          return true;
        }
      }
      pSVar4 = (SQObjectPtr *)
               FallBackSet(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
      if (pSVar4 == (SQObjectPtr *)0x0) {
        local_1 = true;
      }
      else if ((pSVar4 == (SQObjectPtr *)0x1) || (pSVar4 != (SQObjectPtr *)0x2)) {
        if ((in_R8 == (SQObjectPtr *)0x0) &&
           (bVar1 = SQTable::Set(in_stack_ffffffffffffffa8,pSVar4,in_stack_ffffffffffffff98), bVar1)
           ) {
          local_1 = true;
        }
        else {
          Raise_IdxError((SQVM *)CONCAT44(iVar5,in_stack_ffffffffffffffc0),
                         (SQObjectPtr *)in_stack_ffffffffffffffb8);
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    pSVar2 = GetTypeName((SQObjectPtr *)0x168d82);
    Raise_Error(in_RDI,"trying to modify immutable \'%s\'",pSVar2);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQVM::Set(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,SQInteger selfidx)
{
    if (self._flags & SQOBJ_FLAG_IMMUTABLE) {
        Raise_Error(_SC("trying to modify immutable '%s'"),GetTypeName(self));
        return false;
    }

    switch(sq_type(self)){
    case OT_TABLE:
        if(_table(self)->Set(key,val)) return true;
        break;
    case OT_INSTANCE:
        if(_instance(self)->Set(key,val)) return true;
        break;
    case OT_ARRAY:
        if(!sq_isnumeric(key)) { Raise_Error(_SC("indexing %s with %s"),GetTypeName(self),GetTypeName(key)); return false; }
        if(!_array(self)->Set(tointeger(key),val)) {
            Raise_IdxError(key);
            return false;
        }
        return true;
    case OT_USERDATA: break; // must fall back
    default:
        Raise_Error(_SC("trying to set '%s'"),GetTypeName(self));
        return false;
    }

    switch(FallBackSet(self,key,val)) {
        case SLOT_RESOLVE_STATUS_OK: return true; //okie
        case SLOT_RESOLVE_STATUS_NO_MATCH: break; //keep falling back
        case SLOT_RESOLVE_STATUS_ERROR: return false; // the metamethod failed
    }
    if(selfidx == 0) {
        if(_table(_roottable)->Set(key,val))
            return true;
    }
    Raise_IdxError(key);
    return false;
}